

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_title_screen.hpp
# Opt level: O1

uint32_t PatchTitleScreen::inject_pointer_func(ROM *rom,uint32_t pointed_addr)

{
  uint32_t uVar1;
  Code pointer_func;
  string local_c8;
  AddressRegister local_a8;
  Code local_98;
  
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.super_Register._code = '\0';
  local_a8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  local_c8._M_dataplus._M_p = (pointer)&PTR_getXn_00261cd8;
  local_c8._M_string_length = CONCAT44(2,pointed_addr);
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::lea(&local_98,(Param *)&local_c8,&local_a8);
  local_a8.super_Register._code = '\x01';
  local_a8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  local_c8._M_dataplus._M_p = (pointer)&PTR_getXn_00261cd8;
  local_c8._M_string_length = 0x200ff2c00;
  md::Code::lea(&local_98,(Param *)&local_c8,&local_a8);
  md::Code::rts(&local_98);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
  uVar1 = md::ROM::inject_code(rom,&local_98,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_98._labels._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_98._pending_branches._M_t);
  if (local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return uVar1;
}

Assistant:

static uint32_t inject_pointer_func(md::ROM& rom, uint32_t pointed_addr)
    {
        md::Code pointer_func;
        {
            pointer_func.lea(pointed_addr, reg_A0);
            pointer_func.lea(0x00FF2C00, reg_A1);
        }
        pointer_func.rts();

        return rom.inject_code(pointer_func);
    }